

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgba.hpp
# Opt level: O2

uint8_t __thiscall Rgba::grayIndex(Rgba *this)

{
  if ((this->red == this->green) && (this->green == this->blue)) {
    return (uint8_t)((uint)(byte)(options.nbColorsPerPal - options.hasTransparentPixels) *
                     (uint)(byte)~this->red >> 8);
  }
  __assert_fail("isGray()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/rgba.cpp"
                ,0x3b,"uint8_t Rgba::grayIndex() const");
}

Assistant:

bool isGray() const { return red == green && green == blue; }